

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O0

int32_t icu_63::number::impl::AffixUtils::estimateLength
                  (UnicodeString *patternString,UErrorCode *status)

{
  int32_t iVar1;
  uint uVar2;
  int iVar3;
  int local_24;
  UChar32 cp;
  int32_t length;
  int32_t offset;
  AffixPatternState state;
  UErrorCode *status_local;
  UnicodeString *patternString_local;
  
  length = 0;
  local_24 = 0;
  for (cp = 0; iVar1 = UnicodeString::length(patternString), cp < iVar1; cp = iVar3 + cp) {
    uVar2 = UnicodeString::char32At(patternString,cp);
    switch(length) {
    case 0:
      if (uVar2 == 0x27) {
        length = 1;
      }
      else {
        local_24 = local_24 + 1;
      }
      break;
    case 1:
      if (uVar2 == 0x27) {
        length = 0;
      }
      else {
        length = 2;
      }
      local_24 = local_24 + 1;
      break;
    case 2:
      if (uVar2 == 0x27) {
        length = 3;
      }
      else {
        local_24 = local_24 + 1;
      }
      break;
    case 3:
      if (uVar2 == 0x27) {
        length = 2;
      }
      local_24 = local_24 + 1;
    }
    iVar3 = 2;
    if (uVar2 < 0x10000) {
      iVar3 = 1;
    }
  }
  if (length == 1 || length == 2) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return local_24;
}

Assistant:

int32_t AffixUtils::estimateLength(const UnicodeString &patternString, UErrorCode &status) {
    AffixPatternState state = STATE_BASE;
    int32_t offset = 0;
    int32_t length = 0;
    for (; offset < patternString.length();) {
        UChar32 cp = patternString.char32At(offset);

        switch (state) {
            case STATE_BASE:
                if (cp == u'\'') {
                    // First quote
                    state = STATE_FIRST_QUOTE;
                } else {
                    // Unquoted symbol
                    length++;
                }
                break;
            case STATE_FIRST_QUOTE:
                if (cp == u'\'') {
                    // Repeated quote
                    length++;
                    state = STATE_BASE;
                } else {
                    // Quoted code point
                    length++;
                    state = STATE_INSIDE_QUOTE;
                }
                break;
            case STATE_INSIDE_QUOTE:
                if (cp == u'\'') {
                    // End of quoted sequence
                    state = STATE_AFTER_QUOTE;
                } else {
                    // Quoted code point
                    length++;
                }
                break;
            case STATE_AFTER_QUOTE:
                if (cp == u'\'') {
                    // Double quote inside of quoted sequence
                    length++;
                    state = STATE_INSIDE_QUOTE;
                } else {
                    // Unquoted symbol
                    length++;
                }
                break;
            default:
                U_ASSERT(false);
        }

        offset += U16_LENGTH(cp);
    }

    switch (state) {
        case STATE_FIRST_QUOTE:
        case STATE_INSIDE_QUOTE:
            status = U_ILLEGAL_ARGUMENT_ERROR;
            break;
        default:
            break;
    }

    return length;
}